

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

void __thiscall
TPZFMatrix<long>::InitializeEqualFromList
          (TPZFMatrix<long> *this,initializer_list<std::initializer_list<long>_> *list)

{
  size_type sVar1;
  long *plVar2;
  iterator plVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  iterator piVar7;
  iterator piVar8;
  
  piVar8 = list->_M_array;
  sVar1 = list->_M_len;
  (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (this,sVar1,piVar8->_M_len);
  if (sVar1 != 0) {
    piVar7 = piVar8 + sVar1;
    plVar2 = this->fElem;
    uVar4 = 0;
    do {
      if (piVar8->_M_len != 0) {
        plVar3 = piVar8->_M_array;
        lVar5 = piVar8->_M_len << 3;
        uVar6 = 0;
        do {
          plVar2[uVar4 + (uVar6 & 0xffffffff) *
                         (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow] = plVar3[uVar6];
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + -8;
        } while (lVar5 != 0);
      }
      piVar8 = piVar8 + 1;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (piVar8 != piVar7);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::InitializeEqualFromList (const std::initializer_list< std::initializer_list<TVar> >& list){
    size_t n_row = list.size();
    size_t n_col = 1;

    auto row_it = list.begin();
    auto row_it_end = list.end();

#ifdef PZDEBUG
    bool col_n_found = false;
    for (auto it = row_it; it != row_it_end; it++) {
        if (!col_n_found) {
            n_col = it->size();
            col_n_found = true;
        }
        else {
            if (n_col != it->size())
                this->Error("TPZFMatrix constructor: inconsistent number of columns in initializer list");
        }
    }
#else
    n_col = row_it->size();
#endif
    this->Resize(n_row, n_col);

    for (uint32_t row_n = 0; row_it != row_it_end; row_it++, row_n++) {
        auto col_it = row_it->begin();
        auto col_it_end = row_it->end();
        for (uint32_t col_n = 0; col_it != col_it_end; col_it++, col_n++) {
            this->fElem[col_n * this->fRow + row_n] = *col_it;
        }
    }
}